

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON * cJSON_CreateRaw(char *raw)

{
  cJSON *item;
  size_t sVar1;
  char *__dest;
  
  item = (cJSON *)(*global_hooks.allocate)(0x40);
  if (item == (cJSON *)0x0) {
    return (cJSON *)0x0;
  }
  item->child = (cJSON *)0x0;
  *(undefined8 *)&item->type = 0;
  item->valuedouble = 0.0;
  item->string = (char *)0x0;
  item->valuestring = (char *)0x0;
  *(undefined8 *)&item->valueint = 0;
  item->next = (cJSON *)0x0;
  item->prev = (cJSON *)0x0;
  item->type = 0x80;
  if (raw != (char *)0x0) {
    sVar1 = strlen(raw);
    __dest = (char *)(*global_hooks.allocate)(sVar1 + 1);
    if (__dest != (char *)0x0) {
      memcpy(__dest,raw,sVar1 + 1);
      goto LAB_00104a23;
    }
  }
  __dest = (char *)0x0;
LAB_00104a23:
  item->valuestring = __dest;
  if (__dest == (char *)0x0) {
    cJSON_Delete(item);
    item = (cJSON *)0x0;
  }
  return item;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_CreateRaw(const char *raw)
{
    cJSON *item = cJSON_New_Item(&global_hooks);
    if(item)
    {
        item->type = cJSON_Raw;
        item->valuestring = (char*)cJSON_strdup((const unsigned char*)raw, &global_hooks);
        if(!item->valuestring)
        {
            cJSON_Delete(item);
            return NULL;
        }
    }

    return item;
}